

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Colour::Write(Colour *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t size;
  
  size = PayloadSize(this);
  if (size == 0) {
    return true;
  }
  bVar1 = Valid(this);
  if ((((((bVar1) && (bVar1 = WriteEbmlMasterElement(writer,0x55b0,size), bVar1)) &&
        ((this->matrix_coefficients_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b1,this->matrix_coefficients_), bVar1)))) &&
       (((this->bits_per_channel_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b2,this->bits_per_channel_), bVar1)) &&
        ((this->chroma_subsampling_horz_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b3,this->chroma_subsampling_horz_), bVar1)))))) &&
      ((((((this->chroma_subsampling_vert_ == 0xffffffffffffffff ||
           (bVar1 = WriteEbmlElement(writer,0x55b4,this->chroma_subsampling_vert_), bVar1)) &&
          ((this->cb_subsampling_horz_ == 0xffffffffffffffff ||
           (bVar1 = WriteEbmlElement(writer,0x55b5,this->cb_subsampling_horz_), bVar1)))) &&
         ((this->cb_subsampling_vert_ == 0xffffffffffffffff ||
          (bVar1 = WriteEbmlElement(writer,0x55b6,this->cb_subsampling_vert_), bVar1)))) &&
        ((this->chroma_siting_horz_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b7,this->chroma_siting_horz_), bVar1)))) &&
       (((this->chroma_siting_vert_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b8,this->chroma_siting_vert_), bVar1)) &&
        ((this->range_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55b9,this->range_), bVar1)))))))) &&
     (((this->transfer_characteristics_ == 0xffffffffffffffff ||
       (bVar1 = WriteEbmlElement(writer,0x55ba,this->transfer_characteristics_), bVar1)) &&
      (((this->primaries_ == 0xffffffffffffffff ||
        (bVar1 = WriteEbmlElement(writer,0x55bb,this->primaries_), bVar1)) &&
       (((this->max_cll_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55bc,this->max_cll_), bVar1)) &&
        ((this->max_fall_ == 0xffffffffffffffff ||
         (bVar1 = WriteEbmlElement(writer,0x55bd,this->max_fall_), bVar1)))))))))) {
    if (this->mastering_metadata_ == (MasteringMetadata *)0x0) {
      return true;
    }
    bVar1 = MasteringMetadata::Write(this->mastering_metadata_,writer);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Colour::Write(IMkvWriter* writer) const {
  const uint64_t size = PayloadSize();

  // Don't write an empty element.
  if (size == 0)
    return true;

  // Don't write an invalid element.
  if (!Valid())
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvColour, size))
    return false;

  if (matrix_coefficients_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMatrixCoefficients,
                        static_cast<uint64>(matrix_coefficients_))) {
    return false;
  }
  if (bits_per_channel_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvBitsPerChannel,
                        static_cast<uint64>(bits_per_channel_))) {
    return false;
  }
  if (chroma_subsampling_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSubsamplingHorz,
                        static_cast<uint64>(chroma_subsampling_horz_))) {
    return false;
  }
  if (chroma_subsampling_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSubsamplingVert,
                        static_cast<uint64>(chroma_subsampling_vert_))) {
    return false;
  }

  if (cb_subsampling_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvCbSubsamplingHorz,
                        static_cast<uint64>(cb_subsampling_horz_))) {
    return false;
  }
  if (cb_subsampling_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvCbSubsamplingVert,
                        static_cast<uint64>(cb_subsampling_vert_))) {
    return false;
  }
  if (chroma_siting_horz_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSitingHorz,
                        static_cast<uint64>(chroma_siting_horz_))) {
    return false;
  }
  if (chroma_siting_vert_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvChromaSitingVert,
                        static_cast<uint64>(chroma_siting_vert_))) {
    return false;
  }
  if (range_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvRange,
                        static_cast<uint64>(range_))) {
    return false;
  }
  if (transfer_characteristics_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvTransferCharacteristics,
                        static_cast<uint64>(transfer_characteristics_))) {
    return false;
  }
  if (primaries_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvPrimaries,
                        static_cast<uint64>(primaries_))) {
    return false;
  }
  if (max_cll_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMaxCLL,
                        static_cast<uint64>(max_cll_))) {
    return false;
  }
  if (max_fall_ != kValueNotPresent &&
      !WriteEbmlElement(writer, libwebm::kMkvMaxFALL,
                        static_cast<uint64>(max_fall_))) {
    return false;
  }

  if (mastering_metadata_ && !mastering_metadata_->Write(writer))
    return false;

  return true;
}